

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

float * Gia_ManGenerateDelayTableFloat(int nIns,int nOuts)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  
  uVar5 = nOuts * nIns;
  pfVar2 = (float *)malloc((long)(int)uVar5 * 4 + 0xc);
  *pfVar2 = 0.0;
  *(ulong *)(pfVar2 + 1) = CONCAT44((float)nOuts,(float)nIns);
  auVar1 = _DAT_008403e0;
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  else {
    lVar3 = (ulong)uVar5 - 1;
    auVar6._8_4_ = (int)lVar3;
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar6 = auVar6 ^ _DAT_008403e0;
    auVar8 = _DAT_008403c0;
    auVar9 = _DAT_008403d0;
    do {
      auVar10 = auVar9 ^ auVar1;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar10._4_4_ == iVar7 && auVar6._0_4_ < auVar10._0_4_ || iVar7 < auVar10._4_4_)
                & 1)) {
        pfVar2[uVar4 + 3] = 1.0;
      }
      if ((auVar10._12_4_ != auVar6._12_4_ || auVar10._8_4_ <= auVar6._8_4_) &&
          auVar10._12_4_ <= auVar6._12_4_) {
        pfVar2[uVar4 + 4] = 1.0;
      }
      auVar10 = auVar8 ^ auVar1;
      iVar11 = auVar10._4_4_;
      if (iVar11 <= iVar7 && (iVar11 != iVar7 || auVar10._0_4_ <= auVar6._0_4_)) {
        pfVar2[uVar4 + 5] = 1.0;
        pfVar2[uVar4 + 6] = 1.0;
      }
      uVar4 = uVar4 + 4;
      lVar3 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar3 + 4;
      lVar3 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar3 + 4;
    } while ((uVar5 + 3 & 0xfffffffc) != uVar4);
  }
  pfVar2[(int)((uVar5 - nIns) + 3)] = -1e+09;
  return pfVar2;
}

Assistant:

float * Gia_ManGenerateDelayTableFloat( int nIns, int nOuts )
{
    int i, Total = nIns * nOuts;
    float * pDelayTable = ABC_ALLOC( float, Total + 3 );
    pDelayTable[0] = 0;
    pDelayTable[1] = nIns;
    pDelayTable[2] = nOuts;
    for ( i = 0; i < Total; i++ )
        pDelayTable[i+3] = 1;
    pDelayTable[i+3 - nIns] = -ABC_INFINITY;
    return pDelayTable;
}